

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O1

bool __thiscall Algorithms::isPrime_MillerRabin(Algorithms *this,BigInteger *n,int k)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  BigInteger a;
  BigInteger m;
  BigInteger x;
  BigInteger local_138;
  BigInteger local_118;
  uint local_f8;
  int local_f4;
  BigInteger local_f0;
  BigInteger local_d0;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  BigIntegerLibrary::BigInteger::operator%(&local_f0,n,2);
  BigIntegerLibrary::BigInteger::BigInteger(&local_118,0);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_f0,&local_118);
  if (local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bVar1) {
    bVar1 = false;
  }
  else {
    BigIntegerLibrary::BigInteger::operator-(&local_f0,n,1);
    iVar5 = -1;
    while( true ) {
      BigIntegerLibrary::BigInteger::operator%(&local_118,&local_f0,2);
      BigIntegerLibrary::BigInteger::BigInteger(&local_d0,0);
      bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_118,&local_d0);
      if (local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar1) break;
      iVar5 = iVar5 + 1;
      BigIntegerLibrary::BigInteger::operator/=(&local_f0,2);
    }
    bVar1 = k < 1;
    if (0 < k) {
      local_f8 = iVar5 + 1;
      iVar4 = 0;
      do {
        local_f4 = iVar4;
        BigIntegerLibrary::BigInteger::BigInteger(&local_50,2);
        BigIntegerLibrary::BigInteger::operator-(&local_70,n,2);
        random((Algorithms *)&local_118);
        if (local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        BigIntegerLibrary::powm(&local_d0,&local_118,&local_f0,n);
        BigIntegerLibrary::BigInteger::BigInteger(&local_138,1);
        bVar2 = BigIntegerLibrary::BigInteger::operator==(&local_d0,&local_138);
        bVar3 = true;
        if (!bVar2) {
          BigIntegerLibrary::BigInteger::operator-(&local_90,n,1);
          bVar3 = BigIntegerLibrary::BigInteger::operator==(&local_d0,&local_90);
          if (local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
        }
        if (local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar4 = iVar5;
        if (local_f8 < 2 || bVar3 != false) {
          cVar6 = bVar3 * '\x05' + '\x01';
        }
        else {
          do {
            BigIntegerLibrary::BigInteger::operator*(&local_b0,&local_d0,&local_d0);
            BigIntegerLibrary::BigInteger::operator%(&local_138,&local_b0,n);
            BigIntegerLibrary::BigInteger::operator=(&local_d0,&local_138);
            if (local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_b0.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            BigIntegerLibrary::BigInteger::BigInteger(&local_138,1);
            bVar3 = BigIntegerLibrary::BigInteger::operator==(&local_d0,&local_138);
            if (local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            cVar6 = '\x01';
            if (bVar3) break;
            BigIntegerLibrary::BigInteger::operator-(&local_138,n,1);
            bVar3 = BigIntegerLibrary::BigInteger::operator==(&local_d0,&local_138);
            if (local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_138.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar3) {
              cVar6 = '\0';
              break;
            }
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        if (local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((cVar6 != '\x06') && (cVar6 != '\0')) break;
        iVar4 = local_f4 + 1;
        bVar1 = k <= iVar4;
      } while (iVar4 != k);
    }
    if (local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool Algorithms::isPrime_MillerRabin(const BigInteger &n, int k) {
    if (n % 2 == 0) {
        return false;
    }
    BigInteger m = (n - 1);
    int s = 0;
    while (m % 2 == 0) {
        ++s;
        m /= 2;
    }
    for (int i = 0; i < k; ++i) {
        BigInteger a = random(2, n - 2);
        BigInteger x = powm(a, m, n);
        if (x == 1 || x == n - 1) {
            continue;
        }
        bool flag = false;
        for (int j = 0; j < s - 1; ++j) {
            x = x * x % n;
            if (x == 1) {
                return false;
            }
            if (x == n - 1) {
                flag = true;
                break;
            }
        }
        if (!flag) {
            return false;
        }
    }
    return true;
}